

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_sse41_128_16.c
# Opt level: O2

parasail_result_t *
parasail_sw_stats_striped_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  int iVar3;
  parasail_matrix_t *ppVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  int iVar18;
  int iVar19;
  parasail_result_t *result;
  parasail_profile_t *profile_00;
  ulong uVar20;
  parasail_result_t *result_00;
  __m128i *b;
  __m128i *b_00;
  __m128i *palVar21;
  __m128i *palVar22;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *palVar23;
  long lVar24;
  char *pcVar25;
  uint uVar26;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  short sVar27;
  ulong uVar28;
  __m128i *palVar29;
  __m128i *palVar30;
  char *__format;
  __m128i *palVar31;
  ulong uVar32;
  int iVar33;
  long lVar34;
  int iVar35;
  int iVar36;
  __m128i *palVar37;
  __m128i *palVar38;
  bool bVar39;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  ushort uVar54;
  ushort uVar57;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  ushort uVar51;
  ushort uVar59;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  ushort uVar64;
  short sVar66;
  ushort uVar67;
  short sVar69;
  ushort uVar70;
  ushort uVar72;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  short sVar65;
  short sVar68;
  short sVar71;
  short sVar73;
  short sVar74;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  ushort uVar82;
  ushort uVar85;
  ushort uVar86;
  ushort uVar87;
  ushort uVar88;
  ushort uVar89;
  ushort uVar90;
  ushort uVar91;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  short sVar101;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  short sVar105;
  short sVar106;
  short sVar107;
  short sVar108;
  short sVar109;
  short sVar110;
  short sVar111;
  short sVar112;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i c_06;
  __m128i *local_1e0;
  __m128i *local_1d8;
  __m128i *local_1d0;
  __m128i *local_1c8;
  __m128i *local_1c0;
  __m128i *local_1b8;
  __m128i *local_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  __m128i *local_180;
  ulong local_178;
  undefined4 local_16c;
  undefined1 local_158 [16];
  undefined1 local_f8 [16];
  short sVar40;
  short sVar41;
  short sVar50;
  short sVar52;
  short sVar53;
  short sVar55;
  short sVar56;
  short sVar58;
  
  pcVar25 = profile->s1;
  ppVar4 = profile->matrix;
  result = parasail_sw_striped_profile_sse41_128_16(profile,s2,s2Len,open,gap);
  iVar17 = parasail_result_is_saturated(result);
  if (iVar17 != 0) {
    return result;
  }
  iVar17 = result->end_query;
  iVar3 = result->end_ref;
  profile_00 = parasail_profile_create_stats_sse_128_16(pcVar25,iVar17 + 1,ppVar4);
  if (profile_00 == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar25 = "profile";
  }
  else {
    pvVar5 = (profile_00->profile16).score;
    if (pvVar5 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar25 = "profile->profile16.score";
    }
    else {
      ppVar4 = profile_00->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar25 = "profile->matrix";
      }
      else {
        uVar20 = (ulong)(uint)profile_00->s1Len;
        if (profile_00->s1Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar25 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar25 = "s2";
        }
        else if (iVar3 < 0) {
          __format = "%s: %s must be > 0\n";
          pcVar25 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar25 = "open";
        }
        else {
          if (-1 < gap) {
            pvVar6 = (profile_00->profile16).matches;
            pvVar7 = (profile_00->profile16).similar;
            iVar19 = ppVar4->max;
            result_00 = parasail_result_new_stats();
            if (result_00 == (parasail_result_t *)0x0) {
              result_00 = (parasail_result_t *)0x0;
              goto LAB_00650522;
            }
            uVar28 = uVar20 + 7 >> 3;
            result_00->flag = result_00->flag | 0x8210804;
            local_1e0 = parasail_memalign___m128i(0x10,uVar28);
            local_1c8 = parasail_memalign___m128i(0x10,uVar28);
            b = parasail_memalign___m128i(0x10,uVar28);
            local_1d0 = parasail_memalign___m128i(0x10,uVar28);
            b_00 = parasail_memalign___m128i(0x10,uVar28);
            local_1d8 = parasail_memalign___m128i(0x10,uVar28);
            palVar21 = parasail_memalign___m128i(0x10,uVar28);
            palVar22 = parasail_memalign___m128i(0x10,uVar28);
            b_01 = parasail_memalign___m128i(0x10,uVar28);
            b_02 = parasail_memalign___m128i(0x10,uVar28);
            b_03 = parasail_memalign___m128i(0x10,uVar28);
            b_04 = parasail_memalign___m128i(0x10,uVar28);
            local_1b0 = parasail_memalign___m128i(0x10,uVar28);
            local_1c0 = parasail_memalign___m128i(0x10,uVar28);
            local_1b8 = parasail_memalign___m128i(0x10,uVar28);
            palVar23 = parasail_memalign___m128i(0x10,uVar28);
            auVar45._0_8_ = -(ulong)(local_1e0 == (__m128i *)0x0);
            auVar45._8_8_ = -(ulong)(local_1c8 == (__m128i *)0x0);
            auVar116._0_8_ = -(ulong)(b == (__m128i *)0x0);
            auVar116._8_8_ = -(ulong)(local_1d0 == (__m128i *)0x0);
            auVar45 = packssdw(auVar45,auVar116);
            auVar80._0_8_ = -(ulong)(b_00 == (__m128i *)0x0);
            auVar80._8_8_ = -(ulong)(local_1d8 == (__m128i *)0x0);
            auVar115._0_8_ = -(ulong)(palVar21 == (__m128i *)0x0);
            auVar115._8_8_ = -(ulong)(palVar22 == (__m128i *)0x0);
            auVar75 = packssdw(auVar80,auVar115);
            auVar45 = packssdw(auVar45,auVar75);
            auVar75._0_8_ = -(ulong)(b_01 == (__m128i *)0x0);
            auVar75._8_8_ = -(ulong)(b_02 == (__m128i *)0x0);
            auVar84._0_8_ = -(ulong)(b_03 == (__m128i *)0x0);
            auVar84._8_8_ = -(ulong)(b_04 == (__m128i *)0x0);
            auVar75 = packssdw(auVar75,auVar84);
            auVar96._0_8_ = -(ulong)(local_1b0 == (__m128i *)0x0);
            auVar96._8_8_ = -(ulong)(local_1c0 == (__m128i *)0x0);
            auVar95._0_8_ = -(ulong)(local_1b8 == (__m128i *)0x0);
            auVar95._8_8_ = -(ulong)(palVar23 == (__m128i *)0x0);
            auVar80 = packssdw(auVar96,auVar95);
            auVar75 = packssdw(auVar75,auVar80);
            auVar45 = packsswb(auVar45,auVar75);
            if ((((((((((((((((auVar45 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar45 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar45 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar45 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar45 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar45 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar45 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar45 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar45 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar45 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar45 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar45 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar45 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar45 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar45[0xf] < '\0') {
              result_00 = (parasail_result_t *)0x0;
              goto LAB_00650522;
            }
            local_158._8_8_ = local_158._0_8_;
            local_158._0_8_ = palVar23;
            local_178 = 0;
            auVar45 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
            uVar42 = auVar45._0_4_;
            auVar45 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
            uVar43 = auVar45._0_4_;
            c[1] = (longlong)local_1c0;
            c[0] = uVar28;
            palVar23 = b_03;
            parasail_memset___m128i(local_1e0,c,(size_t)b_03);
            c_00[1] = extraout_RDX;
            c_00[0] = uVar28;
            parasail_memset___m128i(b,c_00,(size_t)palVar23);
            c_01[1] = extraout_RDX_00;
            c_01[0] = uVar28;
            parasail_memset___m128i(b_00,c_01,(size_t)palVar23);
            c_02[1] = extraout_RDX_01;
            c_02[0] = uVar28;
            parasail_memset___m128i(palVar21,c_02,(size_t)palVar23);
            c_03[1] = extraout_RDX_02;
            c_03[0] = uVar28;
            parasail_memset___m128i(b_01,c_03,(size_t)palVar23);
            c_04[1] = extraout_RDX_03;
            c_04[0] = uVar28;
            parasail_memset___m128i(b_02,c_04,(size_t)palVar23);
            c_05[1] = extraout_RDX_04;
            c_05[0] = uVar28;
            parasail_memset___m128i(b_03,c_05,(size_t)palVar23);
            c_06[1] = extraout_RDX_05;
            c_06[0] = uVar28;
            parasail_memset___m128i(b_04,c_06,(size_t)palVar23);
            uVar8 = (uint)uVar28;
            uVar26 = uVar8 - 1;
            local_16c = 0x8000;
            uVar32 = 0;
            auVar63 = _DAT_008a1ec0;
            local_1a8 = _DAT_008a1ec0;
            local_198 = _DAT_008a1ec0;
            while( true ) {
              palVar30 = local_1e0;
              palVar31 = b;
              palVar23 = palVar21;
              palVar21 = b_00;
              if (uVar32 == iVar3 + 1U) break;
              uVar9 = palVar30[uVar26][0];
              uVar10 = palVar31[uVar26][0];
              uVar11 = palVar21[uVar26][0];
              uVar12 = palVar23[uVar26][0];
              auVar113._0_8_ = uVar9 << 0x10;
              auVar113._8_8_ = palVar30[uVar26][1] << 0x10 | uVar9 >> 0x30;
              auVar80 = ZEXT416(0x8000);
              auVar45 = pblendw(auVar113,auVar80,1);
              auVar103._0_8_ = uVar10 << 0x10;
              auVar103._8_8_ = palVar31[uVar26][1] << 0x10 | uVar10 >> 0x30;
              auVar75 = pblendw(auVar103,auVar80,1);
              auVar114._0_8_ = uVar11 << 0x10;
              auVar114._8_8_ = palVar21[uVar26][1] << 0x10 | uVar11 >> 0x30;
              lVar34 = (long)(int)(ppVar4->mapper[(byte)s2[uVar32]] * uVar8) * 0x10;
              iVar18 = (int)uVar32 + -2;
              bVar39 = (int)local_178 == iVar18;
              local_180 = (__m128i *)local_158._0_8_;
              if (bVar39) {
                local_180 = palVar22;
              }
              auVar96 = pblendw(auVar114,auVar80,1);
              if (bVar39) {
                palVar22 = (__m128i *)local_158._0_8_;
              }
              auVar60._0_8_ = uVar12 << 0x10;
              auVar60._8_8_ = palVar23[uVar26][1] << 0x10 | uVar12 >> 0x30;
              b_00 = local_1d8;
              if (bVar39) {
                b_00 = local_1b8;
              }
              auVar80 = pblendw(auVar60,auVar80,1);
              local_1e0 = local_1c8;
              b = local_1d0;
              if (bVar39) {
                local_1e0 = local_1b0;
                b = local_1c0;
              }
              local_158 = _DAT_008a1ec0;
              local_f8._8_8_ = 0x8001800180018001;
              local_f8._0_8_ = 0x8001800180018001;
              auVar100 = _DAT_008a1ec0;
              auVar116 = _DAT_008a1ec0;
              for (lVar24 = 0; uVar28 << 4 != lVar24; lVar24 = lVar24 + 0x10) {
                auVar115 = *(undefined1 (*) [16])((long)*b_01 + lVar24);
                auVar84 = *(undefined1 (*) [16])((long)*b_02 + lVar24);
                auVar95 = *(undefined1 (*) [16])((long)*b_03 + lVar24);
                auVar49 = *(undefined1 (*) [16])((long)*b_04 + lVar24);
                auVar45 = paddsw(auVar45,*(undefined1 (*) [16])((long)pvVar5 + lVar24 + lVar34));
                sVar27 = auVar115._0_2_;
                uVar51 = auVar45._0_2_;
                uVar82 = (ushort)((short)uVar51 < sVar27) * sVar27 |
                         ((short)uVar51 >= sVar27) * uVar51;
                sVar27 = auVar115._2_2_;
                uVar54 = auVar45._2_2_;
                uVar85 = (ushort)((short)uVar54 < sVar27) * sVar27 |
                         ((short)uVar54 >= sVar27) * uVar54;
                sVar27 = auVar115._4_2_;
                uVar57 = auVar45._4_2_;
                uVar86 = (ushort)((short)uVar57 < sVar27) * sVar27 |
                         ((short)uVar57 >= sVar27) * uVar57;
                sVar27 = auVar115._6_2_;
                uVar59 = auVar45._6_2_;
                uVar87 = (ushort)((short)uVar59 < sVar27) * sVar27 |
                         ((short)uVar59 >= sVar27) * uVar59;
                sVar27 = auVar115._8_2_;
                uVar64 = auVar45._8_2_;
                uVar88 = (ushort)((short)uVar64 < sVar27) * sVar27 |
                         ((short)uVar64 >= sVar27) * uVar64;
                sVar27 = auVar115._10_2_;
                uVar67 = auVar45._10_2_;
                uVar89 = (ushort)((short)uVar67 < sVar27) * sVar27 |
                         ((short)uVar67 >= sVar27) * uVar67;
                sVar27 = auVar115._12_2_;
                uVar70 = auVar45._12_2_;
                uVar72 = auVar45._14_2_;
                uVar90 = (ushort)((short)uVar70 < sVar27) * sVar27 |
                         ((short)uVar70 >= sVar27) * uVar70;
                sVar27 = auVar115._14_2_;
                uVar91 = (ushort)((short)uVar72 < sVar27) * sVar27 |
                         ((short)uVar72 >= sVar27) * uVar72;
                sVar27 = auVar100._0_2_;
                auVar76._0_2_ =
                     (ushort)((short)uVar82 < sVar27) * sVar27 | ((short)uVar82 >= sVar27) * uVar82;
                sVar40 = auVar100._2_2_;
                auVar76._2_2_ =
                     (ushort)((short)uVar85 < sVar40) * sVar40 | ((short)uVar85 >= sVar40) * uVar85;
                sVar50 = auVar100._4_2_;
                auVar76._4_2_ =
                     (ushort)((short)uVar86 < sVar50) * sVar50 | ((short)uVar86 >= sVar50) * uVar86;
                sVar53 = auVar100._6_2_;
                auVar76._6_2_ =
                     (ushort)((short)uVar87 < sVar53) * sVar53 | ((short)uVar87 >= sVar53) * uVar87;
                sVar41 = auVar100._8_2_;
                auVar76._8_2_ =
                     (ushort)((short)uVar88 < sVar41) * sVar41 | ((short)uVar88 >= sVar41) * uVar88;
                sVar52 = auVar100._10_2_;
                auVar76._10_2_ =
                     (ushort)((short)uVar89 < sVar52) * sVar52 | ((short)uVar89 >= sVar52) * uVar89;
                sVar55 = auVar100._12_2_;
                auVar76._12_2_ =
                     (ushort)((short)uVar90 < sVar55) * sVar55 | ((short)uVar90 >= sVar55) * uVar90;
                sVar56 = auVar100._14_2_;
                auVar76._14_2_ =
                     (ushort)((short)uVar91 < sVar56) * sVar56 | ((short)uVar91 >= sVar56) * uVar91;
                *(undefined1 (*) [16])((long)*local_1e0 + lVar24) = auVar76;
                auVar45 = _DAT_008a1ec0;
                auVar83._0_2_ = -(ushort)(sVar27 < (short)uVar82);
                auVar83._2_2_ = -(ushort)(sVar40 < (short)uVar85);
                auVar83._4_2_ = -(ushort)(sVar50 < (short)uVar86);
                auVar83._6_2_ = -(ushort)(sVar53 < (short)uVar87);
                auVar83._8_2_ = -(ushort)(sVar41 < (short)uVar88);
                auVar83._10_2_ = -(ushort)(sVar52 < (short)uVar89);
                auVar83._12_2_ = -(ushort)(sVar55 < (short)uVar90);
                auVar83._14_2_ = -(ushort)(sVar56 < (short)uVar91);
                auVar113 = pblendvb(auVar116,auVar84,auVar83);
                auVar75 = paddsw(auVar75,*(undefined1 (*) [16])((long)pvVar6 + lVar24 + lVar34));
                auVar93._0_2_ = -(ushort)(uVar51 == auVar76._0_2_);
                auVar93._2_2_ = -(ushort)(uVar54 == auVar76._2_2_);
                auVar93._4_2_ = -(ushort)(uVar57 == auVar76._4_2_);
                auVar93._6_2_ = -(ushort)(uVar59 == auVar76._6_2_);
                auVar93._8_2_ = -(ushort)(uVar64 == auVar76._8_2_);
                auVar93._10_2_ = -(ushort)(uVar67 == auVar76._10_2_);
                auVar93._12_2_ = -(ushort)(uVar70 == auVar76._12_2_);
                auVar93._14_2_ = -(ushort)(uVar72 == auVar76._14_2_);
                auVar75 = pblendvb(auVar113,auVar75,auVar93);
                auVar81._0_2_ = -(ushort)(auVar76._0_2_ == (ushort)DAT_008a1ec0);
                auVar81._2_2_ = -(ushort)(auVar76._2_2_ == DAT_008a1ec0._2_2_);
                auVar81._4_2_ = -(ushort)(auVar76._4_2_ == DAT_008a1ec0._4_2_);
                auVar81._6_2_ = -(ushort)(auVar76._6_2_ == DAT_008a1ec0._6_2_);
                auVar81._8_2_ = -(ushort)(auVar76._8_2_ == DAT_008a1ec0._8_2_);
                auVar81._10_2_ = -(ushort)(auVar76._10_2_ == DAT_008a1ec0._10_2_);
                auVar81._12_2_ = -(ushort)(auVar76._12_2_ == DAT_008a1ec0._12_2_);
                auVar81._14_2_ = -(ushort)(auVar76._14_2_ == DAT_008a1ec0._14_2_);
                auVar114 = pblendvb(auVar75,_DAT_008a1ec0,auVar81);
                *(undefined1 (*) [16])((long)*b + lVar24) = auVar114;
                auVar113 = pblendvb(local_158,auVar95,auVar83);
                auVar75 = paddsw(auVar96,*(undefined1 (*) [16])((long)pvVar7 + lVar24 + lVar34));
                auVar75 = pblendvb(auVar113,auVar75,auVar93);
                auVar113 = pblendvb(auVar75,auVar45,auVar81);
                auVar96 = pblendvb(local_f8,auVar49,auVar83);
                auVar75 = pmovsxbw(auVar83,0x101010101010101);
                auVar75 = paddsw(auVar80,auVar75);
                auVar75 = pblendvb(auVar96,auVar75,auVar93);
                auVar80 = pblendvb(auVar75,auVar45,auVar81);
                *(undefined1 (*) [16])((long)*b_00 + lVar24) = auVar113;
                *(undefined1 (*) [16])((long)*palVar22 + lVar24) = auVar80;
                sVar27 = auVar80._0_2_;
                sVar40 = auVar113._0_2_;
                uVar88 = (ushort)(sVar40 < sVar27) * sVar27 | (ushort)(sVar40 >= sVar27) * sVar40;
                sVar27 = auVar80._2_2_;
                sVar40 = auVar113._2_2_;
                uVar64 = (ushort)(sVar40 < sVar27) * sVar27 | (ushort)(sVar40 >= sVar27) * sVar40;
                sVar27 = auVar80._4_2_;
                sVar40 = auVar113._4_2_;
                uVar89 = (ushort)(sVar40 < sVar27) * sVar27 | (ushort)(sVar40 >= sVar27) * sVar40;
                sVar27 = auVar80._6_2_;
                sVar40 = auVar113._6_2_;
                uVar67 = (ushort)(sVar40 < sVar27) * sVar27 | (ushort)(sVar40 >= sVar27) * sVar40;
                sVar27 = auVar80._8_2_;
                sVar40 = auVar113._8_2_;
                uVar90 = (ushort)(sVar40 < sVar27) * sVar27 | (ushort)(sVar40 >= sVar27) * sVar40;
                sVar27 = auVar80._10_2_;
                sVar40 = auVar113._10_2_;
                uVar70 = (ushort)(sVar40 < sVar27) * sVar27 | (ushort)(sVar40 >= sVar27) * sVar40;
                sVar27 = auVar80._12_2_;
                sVar40 = auVar113._12_2_;
                sVar50 = auVar113._14_2_;
                uVar72 = (ushort)(sVar40 < sVar27) * sVar27 | (ushort)(sVar40 >= sVar27) * sVar40;
                sVar27 = auVar80._14_2_;
                uVar91 = (ushort)(sVar50 < sVar27) * sVar27 | (ushort)(sVar50 >= sVar27) * sVar50;
                local_198._2_2_ =
                     ((short)local_198._2_2_ < (short)auVar76._2_2_) * auVar76._2_2_ |
                     (ushort)((short)local_198._2_2_ >= (short)auVar76._2_2_) * local_198._2_2_;
                local_198._0_2_ =
                     ((short)local_198._0_2_ < (short)auVar76._0_2_) * auVar76._0_2_ |
                     (ushort)((short)local_198._0_2_ >= (short)auVar76._0_2_) * local_198._0_2_;
                local_198._4_2_ =
                     ((short)local_198._4_2_ < (short)auVar76._4_2_) * auVar76._4_2_ |
                     (ushort)((short)local_198._4_2_ >= (short)auVar76._4_2_) * local_198._4_2_;
                local_198._6_2_ =
                     ((short)local_198._6_2_ < (short)auVar76._6_2_) * auVar76._6_2_ |
                     (ushort)((short)local_198._6_2_ >= (short)auVar76._6_2_) * local_198._6_2_;
                local_198._8_2_ =
                     ((short)local_198._8_2_ < (short)auVar76._8_2_) * auVar76._8_2_ |
                     (ushort)((short)local_198._8_2_ >= (short)auVar76._8_2_) * local_198._8_2_;
                local_198._10_2_ =
                     ((short)local_198._10_2_ < (short)auVar76._10_2_) * auVar76._10_2_ |
                     (ushort)((short)local_198._10_2_ >= (short)auVar76._10_2_) * local_198._10_2_;
                local_198._12_2_ =
                     ((short)local_198._12_2_ < (short)auVar76._12_2_) * auVar76._12_2_ |
                     (ushort)((short)local_198._12_2_ >= (short)auVar76._12_2_) * local_198._12_2_;
                local_198._14_2_ =
                     ((short)local_198._14_2_ < (short)auVar76._14_2_) * auVar76._14_2_ |
                     (ushort)((short)local_198._14_2_ >= (short)auVar76._14_2_) * local_198._14_2_;
                auVar15._4_4_ = uVar42;
                auVar15._0_4_ = uVar42;
                auVar15._8_4_ = uVar42;
                auVar15._12_4_ = uVar42;
                auVar45 = psubsw(auVar76,auVar15);
                auVar13._4_4_ = uVar43;
                auVar13._0_4_ = uVar43;
                auVar13._8_4_ = uVar43;
                auVar13._12_4_ = uVar43;
                auVar75 = psubsw(auVar115,auVar13);
                sVar40 = auVar45._0_2_;
                sVar105 = auVar75._0_2_;
                auVar46._0_2_ = -(ushort)(sVar105 < sVar40);
                sVar50 = auVar45._2_2_;
                sVar106 = auVar75._2_2_;
                auVar46._2_2_ = -(ushort)(sVar106 < sVar50);
                sVar53 = auVar45._4_2_;
                sVar107 = auVar75._4_2_;
                auVar46._4_2_ = -(ushort)(sVar107 < sVar53);
                sVar41 = auVar45._6_2_;
                sVar108 = auVar75._6_2_;
                auVar46._6_2_ = -(ushort)(sVar108 < sVar41);
                sVar52 = auVar45._8_2_;
                sVar109 = auVar75._8_2_;
                auVar46._8_2_ = -(ushort)(sVar109 < sVar52);
                sVar55 = auVar45._10_2_;
                sVar110 = auVar75._10_2_;
                auVar46._10_2_ = -(ushort)(sVar110 < sVar55);
                sVar56 = auVar45._12_2_;
                sVar111 = auVar75._12_2_;
                sVar58 = auVar45._14_2_;
                auVar46._12_2_ = -(ushort)(sVar111 < sVar56);
                sVar112 = auVar75._14_2_;
                auVar46._14_2_ = -(ushort)(sVar112 < sVar58);
                auVar75 = pblendvb(auVar84,auVar114,auVar46);
                auVar115 = pblendvb(auVar95,auVar113,auVar46);
                auVar45 = pmovsxbw(auVar81,0x101010101010101);
                auVar96 = paddsw(auVar49,auVar45);
                auVar45 = paddsw(auVar80,auVar45);
                auVar96 = pblendvb(auVar96,auVar45,auVar46);
                auVar80 = psubsw(auVar100,auVar13);
                sVar65 = auVar80._0_2_;
                auVar77._0_2_ = -(ushort)(sVar65 < sVar40);
                sVar66 = auVar80._2_2_;
                auVar77._2_2_ = -(ushort)(sVar66 < sVar50);
                sVar68 = auVar80._4_2_;
                auVar77._4_2_ = -(ushort)(sVar68 < sVar53);
                sVar69 = auVar80._6_2_;
                auVar77._6_2_ = -(ushort)(sVar69 < sVar41);
                sVar71 = auVar80._8_2_;
                auVar77._8_2_ = -(ushort)(sVar71 < sVar52);
                sVar73 = auVar80._10_2_;
                auVar77._10_2_ = -(ushort)(sVar73 < sVar55);
                sVar74 = auVar80._12_2_;
                auVar77._12_2_ = -(ushort)(sVar74 < sVar56);
                sVar101 = auVar80._14_2_;
                auVar77._14_2_ = -(ushort)(sVar101 < sVar58);
                auVar116 = pblendvb(auVar116,auVar114,auVar77);
                sVar27 = auVar114._0_2_;
                uVar82 = (ushort)((short)local_1a8._0_2_ < sVar27) * sVar27 |
                         (ushort)((short)local_1a8._0_2_ >= sVar27) * local_1a8._0_2_;
                sVar27 = auVar114._2_2_;
                uVar51 = (ushort)((short)local_1a8._2_2_ < sVar27) * sVar27 |
                         (ushort)((short)local_1a8._2_2_ >= sVar27) * local_1a8._2_2_;
                sVar27 = auVar114._4_2_;
                uVar54 = (ushort)((short)local_1a8._4_2_ < sVar27) * sVar27 |
                         (ushort)((short)local_1a8._4_2_ >= sVar27) * local_1a8._4_2_;
                sVar27 = auVar114._6_2_;
                uVar85 = (ushort)((short)local_1a8._6_2_ < sVar27) * sVar27 |
                         (ushort)((short)local_1a8._6_2_ >= sVar27) * local_1a8._6_2_;
                sVar27 = auVar114._8_2_;
                uVar86 = (ushort)((short)local_1a8._8_2_ < sVar27) * sVar27 |
                         (ushort)((short)local_1a8._8_2_ >= sVar27) * local_1a8._8_2_;
                sVar27 = auVar114._10_2_;
                uVar57 = (ushort)((short)local_1a8._10_2_ < sVar27) * sVar27 |
                         (ushort)((short)local_1a8._10_2_ >= sVar27) * local_1a8._10_2_;
                sVar27 = auVar114._12_2_;
                uVar87 = (ushort)((short)local_1a8._12_2_ < sVar27) * sVar27 |
                         (ushort)((short)local_1a8._12_2_ >= sVar27) * local_1a8._12_2_;
                sVar27 = auVar114._14_2_;
                uVar59 = (ushort)((short)local_1a8._14_2_ < sVar27) * sVar27 |
                         (ushort)((short)local_1a8._14_2_ >= sVar27) * local_1a8._14_2_;
                local_1a8._2_2_ =
                     ((short)uVar51 < (short)uVar64) * uVar64 |
                     ((short)uVar51 >= (short)uVar64) * uVar51;
                local_1a8._0_2_ =
                     ((short)uVar82 < (short)uVar88) * uVar88 |
                     ((short)uVar82 >= (short)uVar88) * uVar82;
                local_1a8._4_2_ =
                     ((short)uVar54 < (short)uVar89) * uVar89 |
                     ((short)uVar54 >= (short)uVar89) * uVar54;
                local_1a8._6_2_ =
                     ((short)uVar85 < (short)uVar67) * uVar67 |
                     ((short)uVar85 >= (short)uVar67) * uVar85;
                local_1a8._8_2_ =
                     ((short)uVar86 < (short)uVar90) * uVar90 |
                     ((short)uVar86 >= (short)uVar90) * uVar86;
                local_1a8._10_2_ =
                     ((short)uVar57 < (short)uVar70) * uVar70 |
                     ((short)uVar57 >= (short)uVar70) * uVar57;
                local_1a8._12_2_ =
                     ((short)uVar87 < (short)uVar72) * uVar72 |
                     ((short)uVar87 >= (short)uVar72) * uVar87;
                local_1a8._14_2_ =
                     ((short)uVar59 < (short)uVar91) * uVar91 |
                     ((short)uVar59 >= (short)uVar91) * uVar59;
                puVar1 = (ushort *)((long)*b_01 + lVar24);
                *puVar1 = (ushort)(sVar40 < sVar105) * sVar105 |
                          (ushort)(sVar40 >= sVar105) * sVar40;
                puVar1[1] = (ushort)(sVar50 < sVar106) * sVar106 |
                            (ushort)(sVar50 >= sVar106) * sVar50;
                puVar1[2] = (ushort)(sVar53 < sVar107) * sVar107 |
                            (ushort)(sVar53 >= sVar107) * sVar53;
                puVar1[3] = (ushort)(sVar41 < sVar108) * sVar108 |
                            (ushort)(sVar41 >= sVar108) * sVar41;
                puVar1[4] = (ushort)(sVar52 < sVar109) * sVar109 |
                            (ushort)(sVar52 >= sVar109) * sVar52;
                puVar1[5] = (ushort)(sVar55 < sVar110) * sVar110 |
                            (ushort)(sVar55 >= sVar110) * sVar55;
                puVar1[6] = (ushort)(sVar56 < sVar111) * sVar111 |
                            (ushort)(sVar56 >= sVar111) * sVar56;
                puVar1[7] = (ushort)(sVar58 < sVar112) * sVar112 |
                            (ushort)(sVar58 >= sVar112) * sVar58;
                *(undefined1 (*) [16])((long)*b_02 + lVar24) = auVar75;
                *(undefined1 (*) [16])((long)*b_03 + lVar24) = auVar115;
                *(undefined1 (*) [16])((long)*b_04 + lVar24) = auVar96;
                auVar100._0_2_ =
                     (ushort)(sVar40 < sVar65) * sVar65 | (ushort)(sVar40 >= sVar65) * sVar40;
                auVar100._2_2_ =
                     (ushort)(sVar50 < sVar66) * sVar66 | (ushort)(sVar50 >= sVar66) * sVar50;
                auVar100._4_2_ =
                     (ushort)(sVar53 < sVar68) * sVar68 | (ushort)(sVar53 >= sVar68) * sVar53;
                auVar100._6_2_ =
                     (ushort)(sVar41 < sVar69) * sVar69 | (ushort)(sVar41 >= sVar69) * sVar41;
                auVar100._8_2_ =
                     (ushort)(sVar52 < sVar71) * sVar71 | (ushort)(sVar52 >= sVar71) * sVar52;
                auVar100._10_2_ =
                     (ushort)(sVar55 < sVar73) * sVar73 | (ushort)(sVar55 >= sVar73) * sVar55;
                auVar100._12_2_ =
                     (ushort)(sVar56 < sVar74) * sVar74 | (ushort)(sVar56 >= sVar74) * sVar56;
                auVar100._14_2_ =
                     (ushort)(sVar58 < sVar101) * sVar101 | (ushort)(sVar58 >= sVar101) * sVar58;
                local_158 = pblendvb(local_158,auVar113,auVar77);
                auVar75 = paddsw(local_f8,_DAT_008a1ba0);
                local_f8 = pblendvb(auVar75,auVar45,auVar77);
                auVar45 = *(undefined1 (*) [16])((long)*palVar30 + lVar24);
                auVar75 = *(undefined1 (*) [16])((long)*palVar31 + lVar24);
                auVar96 = *(undefined1 (*) [16])((long)*palVar21 + lVar24);
                auVar80 = *(undefined1 (*) [16])((long)*palVar23 + lVar24);
              }
              if ((int)local_178 == iVar18) {
                local_1b0 = local_1c8;
                local_1c0 = local_1d0;
                local_1b8 = local_1d8;
              }
              auVar45 = local_158;
              for (iVar18 = 0; iVar18 != 8; iVar18 = iVar18 + 1) {
                uVar9 = palVar30[uVar26][0];
                auVar78._0_8_ = uVar9 << 0x10;
                auVar78._8_8_ = palVar30[uVar26][1] << 0x10 | uVar9 >> 0x30;
                auVar80 = ZEXT416(0x8000);
                auVar75 = pblendw(auVar78,auVar80,1);
                auVar99._0_8_ = auVar100._0_8_ << 0x10;
                auVar99._8_8_ = auVar100._8_8_ << 0x10 | auVar100._0_8_ >> 0x30;
                auVar100 = pblendw(auVar99,auVar80,1);
                auVar117._0_8_ = auVar116._0_8_ << 0x10;
                auVar117._8_8_ = auVar116._8_8_ << 0x10 | auVar116._0_8_ >> 0x30;
                auVar116 = pblendw(auVar117,auVar80,1);
                auVar102._0_8_ = auVar45._0_8_ << 0x10;
                auVar102._8_8_ = auVar45._8_8_ << 0x10 | auVar45._0_8_ >> 0x30;
                auVar45 = pblendw(auVar102,auVar80,1);
                auVar104._0_8_ = local_f8._0_8_ << 0x10;
                auVar104._8_8_ = local_f8._8_8_ << 0x10 | local_f8._0_8_ >> 0x30;
                local_f8 = pblendw(auVar104,_DAT_008a2380,1);
                auVar80 = local_198;
                for (lVar24 = 0; uVar28 << 4 != lVar24; lVar24 = lVar24 + 0x10) {
                  auVar75 = paddsw(auVar75,*(undefined1 (*) [16])((long)pvVar5 + lVar24 + lVar34));
                  psVar2 = (short *)((long)*local_1e0 + lVar24);
                  sVar58 = *psVar2;
                  sVar65 = psVar2[1];
                  sVar66 = psVar2[2];
                  sVar68 = psVar2[3];
                  sVar69 = psVar2[4];
                  sVar71 = psVar2[5];
                  sVar73 = psVar2[6];
                  sVar74 = psVar2[7];
                  sVar27 = auVar100._0_2_;
                  auVar61._0_2_ =
                       (ushort)(sVar58 < sVar27) * sVar27 | (ushort)(sVar58 >= sVar27) * sVar58;
                  sVar40 = auVar100._2_2_;
                  auVar61._2_2_ =
                       (ushort)(sVar65 < sVar40) * sVar40 | (ushort)(sVar65 >= sVar40) * sVar65;
                  sVar50 = auVar100._4_2_;
                  auVar61._4_2_ =
                       (ushort)(sVar66 < sVar50) * sVar50 | (ushort)(sVar66 >= sVar50) * sVar66;
                  sVar53 = auVar100._6_2_;
                  auVar61._6_2_ =
                       (ushort)(sVar68 < sVar53) * sVar53 | (ushort)(sVar68 >= sVar53) * sVar68;
                  sVar41 = auVar100._8_2_;
                  auVar61._8_2_ =
                       (ushort)(sVar69 < sVar41) * sVar41 | (ushort)(sVar69 >= sVar41) * sVar69;
                  sVar52 = auVar100._10_2_;
                  auVar61._10_2_ =
                       (ushort)(sVar71 < sVar52) * sVar52 | (ushort)(sVar71 >= sVar52) * sVar71;
                  sVar55 = auVar100._12_2_;
                  auVar61._12_2_ =
                       (ushort)(sVar73 < sVar55) * sVar55 | (ushort)(sVar73 >= sVar55) * sVar73;
                  sVar56 = auVar100._14_2_;
                  auVar61._14_2_ =
                       (ushort)(sVar74 < sVar56) * sVar56 | (ushort)(sVar74 >= sVar56) * sVar74;
                  *(undefined1 (*) [16])((long)*local_1e0 + lVar24) = auVar61;
                  auVar79._0_2_ = -(ushort)(auVar75._0_2_ == auVar61._0_2_);
                  auVar79._2_2_ = -(ushort)(auVar75._2_2_ == auVar61._2_2_);
                  auVar79._4_2_ = -(ushort)(auVar75._4_2_ == auVar61._4_2_);
                  auVar79._6_2_ = -(ushort)(auVar75._6_2_ == auVar61._6_2_);
                  auVar79._8_2_ = -(ushort)(auVar75._8_2_ == auVar61._8_2_);
                  auVar79._10_2_ = -(ushort)(auVar75._10_2_ == auVar61._10_2_);
                  auVar79._12_2_ = -(ushort)(auVar75._12_2_ == auVar61._12_2_);
                  auVar79._14_2_ = -(ushort)(auVar75._14_2_ == auVar61._14_2_);
                  auVar47._0_2_ = -(ushort)(sVar27 < sVar58);
                  auVar47._2_2_ = -(ushort)(sVar40 < sVar65);
                  auVar47._4_2_ = -(ushort)(sVar50 < sVar66);
                  auVar47._6_2_ = -(ushort)(sVar53 < sVar68);
                  auVar47._8_2_ = -(ushort)(sVar41 < sVar69);
                  auVar47._10_2_ = -(ushort)(sVar52 < sVar71);
                  auVar47._12_2_ = -(ushort)(sVar55 < sVar73);
                  auVar47._14_2_ = -(ushort)(sVar56 < sVar74);
                  auVar47 = auVar47 | auVar79;
                  auVar96 = pblendvb(auVar116,*(undefined1 (*) [16])((long)*b + lVar24),auVar47);
                  *(undefined1 (*) [16])((long)*b + lVar24) = auVar96;
                  auVar84 = pblendvb(auVar45,*(undefined1 (*) [16])((long)*b_00 + lVar24),auVar47);
                  *(undefined1 (*) [16])((long)*b_00 + lVar24) = auVar84;
                  auVar115 = pblendvb(local_f8,*(undefined1 (*) [16])((long)*palVar22 + lVar24),
                                      auVar47);
                  *(undefined1 (*) [16])((long)*palVar22 + lVar24) = auVar115;
                  sVar27 = auVar96._0_2_;
                  sVar40 = local_1a8._0_2_;
                  uVar82 = (ushort)(sVar40 < sVar27) * sVar27 | (ushort)(sVar40 >= sVar27) * sVar40;
                  sVar27 = auVar96._2_2_;
                  sVar40 = local_1a8._2_2_;
                  uVar51 = (ushort)(sVar40 < sVar27) * sVar27 | (ushort)(sVar40 >= sVar27) * sVar40;
                  sVar27 = auVar96._4_2_;
                  sVar40 = local_1a8._4_2_;
                  uVar54 = (ushort)(sVar40 < sVar27) * sVar27 | (ushort)(sVar40 >= sVar27) * sVar40;
                  sVar27 = auVar96._6_2_;
                  sVar40 = local_1a8._6_2_;
                  uVar85 = (ushort)(sVar40 < sVar27) * sVar27 | (ushort)(sVar40 >= sVar27) * sVar40;
                  sVar27 = auVar96._8_2_;
                  sVar40 = local_1a8._8_2_;
                  uVar86 = (ushort)(sVar40 < sVar27) * sVar27 | (ushort)(sVar40 >= sVar27) * sVar40;
                  sVar27 = auVar96._10_2_;
                  sVar40 = local_1a8._10_2_;
                  uVar57 = (ushort)(sVar40 < sVar27) * sVar27 | (ushort)(sVar40 >= sVar27) * sVar40;
                  sVar27 = auVar96._12_2_;
                  sVar40 = local_1a8._12_2_;
                  sVar50 = local_1a8._14_2_;
                  uVar87 = (ushort)(sVar40 < sVar27) * sVar27 | (ushort)(sVar40 >= sVar27) * sVar40;
                  sVar27 = auVar96._14_2_;
                  uVar59 = (ushort)(sVar50 < sVar27) * sVar27 | (ushort)(sVar50 >= sVar27) * sVar50;
                  sVar27 = auVar115._0_2_;
                  sVar40 = auVar84._0_2_;
                  uVar88 = (ushort)(sVar40 < sVar27) * sVar27 | (ushort)(sVar40 >= sVar27) * sVar40;
                  sVar27 = auVar115._2_2_;
                  sVar40 = auVar84._2_2_;
                  uVar64 = (ushort)(sVar40 < sVar27) * sVar27 | (ushort)(sVar40 >= sVar27) * sVar40;
                  sVar27 = auVar115._4_2_;
                  sVar40 = auVar84._4_2_;
                  uVar89 = (ushort)(sVar40 < sVar27) * sVar27 | (ushort)(sVar40 >= sVar27) * sVar40;
                  sVar27 = auVar115._6_2_;
                  sVar40 = auVar84._6_2_;
                  uVar67 = (ushort)(sVar40 < sVar27) * sVar27 | (ushort)(sVar40 >= sVar27) * sVar40;
                  sVar27 = auVar115._8_2_;
                  sVar40 = auVar84._8_2_;
                  uVar90 = (ushort)(sVar40 < sVar27) * sVar27 | (ushort)(sVar40 >= sVar27) * sVar40;
                  sVar27 = auVar115._10_2_;
                  sVar40 = auVar84._10_2_;
                  uVar70 = (ushort)(sVar40 < sVar27) * sVar27 | (ushort)(sVar40 >= sVar27) * sVar40;
                  sVar27 = auVar115._12_2_;
                  sVar40 = auVar84._12_2_;
                  sVar50 = auVar84._14_2_;
                  uVar72 = (ushort)(sVar40 < sVar27) * sVar27 | (ushort)(sVar40 >= sVar27) * sVar40;
                  sVar27 = auVar115._14_2_;
                  uVar91 = (ushort)(sVar50 < sVar27) * sVar27 | (ushort)(sVar50 >= sVar27) * sVar50;
                  local_1a8._0_2_ =
                       ((short)uVar88 < (short)uVar82) * uVar82 |
                       ((short)uVar88 >= (short)uVar82) * uVar88;
                  local_1a8._2_2_ =
                       ((short)uVar64 < (short)uVar51) * uVar51 |
                       ((short)uVar64 >= (short)uVar51) * uVar64;
                  local_1a8._4_2_ =
                       ((short)uVar89 < (short)uVar54) * uVar54 |
                       ((short)uVar89 >= (short)uVar54) * uVar89;
                  local_1a8._6_2_ =
                       ((short)uVar67 < (short)uVar85) * uVar85 |
                       ((short)uVar67 >= (short)uVar85) * uVar67;
                  local_1a8._8_2_ =
                       ((short)uVar90 < (short)uVar86) * uVar86 |
                       ((short)uVar90 >= (short)uVar86) * uVar90;
                  local_1a8._10_2_ =
                       ((short)uVar70 < (short)uVar57) * uVar57 |
                       ((short)uVar70 >= (short)uVar57) * uVar70;
                  local_1a8._12_2_ =
                       ((short)uVar72 < (short)uVar87) * uVar87 |
                       ((short)uVar72 >= (short)uVar87) * uVar72;
                  local_1a8._14_2_ =
                       ((short)uVar91 < (short)uVar59) * uVar59 |
                       ((short)uVar91 >= (short)uVar59) * uVar91;
                  sVar27 = auVar80._0_2_;
                  local_198._0_2_ =
                       (sVar27 < (short)auVar61._0_2_) * auVar61._0_2_ |
                       (ushort)(sVar27 >= (short)auVar61._0_2_) * sVar27;
                  sVar27 = auVar80._2_2_;
                  local_198._2_2_ =
                       (sVar27 < (short)auVar61._2_2_) * auVar61._2_2_ |
                       (ushort)(sVar27 >= (short)auVar61._2_2_) * sVar27;
                  sVar27 = auVar80._4_2_;
                  local_198._4_2_ =
                       (sVar27 < (short)auVar61._4_2_) * auVar61._4_2_ |
                       (ushort)(sVar27 >= (short)auVar61._4_2_) * sVar27;
                  sVar27 = auVar80._6_2_;
                  local_198._6_2_ =
                       (sVar27 < (short)auVar61._6_2_) * auVar61._6_2_ |
                       (ushort)(sVar27 >= (short)auVar61._6_2_) * sVar27;
                  sVar27 = auVar80._8_2_;
                  local_198._8_2_ =
                       (sVar27 < (short)auVar61._8_2_) * auVar61._8_2_ |
                       (ushort)(sVar27 >= (short)auVar61._8_2_) * sVar27;
                  sVar27 = auVar80._10_2_;
                  local_198._10_2_ =
                       (sVar27 < (short)auVar61._10_2_) * auVar61._10_2_ |
                       (ushort)(sVar27 >= (short)auVar61._10_2_) * sVar27;
                  sVar27 = auVar80._12_2_;
                  sVar40 = auVar80._14_2_;
                  local_198._12_2_ =
                       (sVar27 < (short)auVar61._12_2_) * auVar61._12_2_ |
                       (ushort)(sVar27 >= (short)auVar61._12_2_) * sVar27;
                  local_198._14_2_ =
                       (sVar40 < (short)auVar61._14_2_) * auVar61._14_2_ |
                       (ushort)(sVar40 >= (short)auVar61._14_2_) * sVar40;
                  auVar16._4_4_ = uVar42;
                  auVar16._0_4_ = uVar42;
                  auVar16._8_4_ = uVar42;
                  auVar16._12_4_ = uVar42;
                  auVar75 = psubsw(auVar61,auVar16);
                  auVar14._4_4_ = uVar43;
                  auVar14._0_4_ = uVar43;
                  auVar14._8_4_ = uVar43;
                  auVar14._12_4_ = uVar43;
                  auVar100 = psubsw(auVar100,auVar14);
                  sVar27 = auVar100._0_2_;
                  sVar58 = auVar75._0_2_;
                  auVar98._0_2_ = -(ushort)(sVar58 < sVar27);
                  sVar40 = auVar100._2_2_;
                  sVar65 = auVar75._2_2_;
                  auVar98._2_2_ = -(ushort)(sVar65 < sVar40);
                  sVar50 = auVar100._4_2_;
                  sVar66 = auVar75._4_2_;
                  auVar98._4_2_ = -(ushort)(sVar66 < sVar50);
                  sVar53 = auVar100._6_2_;
                  sVar68 = auVar75._6_2_;
                  auVar98._6_2_ = -(ushort)(sVar68 < sVar53);
                  sVar41 = auVar100._8_2_;
                  sVar69 = auVar75._8_2_;
                  auVar98._8_2_ = -(ushort)(sVar69 < sVar41);
                  sVar52 = auVar100._10_2_;
                  sVar71 = auVar75._10_2_;
                  auVar98._10_2_ = -(ushort)(sVar71 < sVar52);
                  sVar55 = auVar100._12_2_;
                  sVar73 = auVar75._12_2_;
                  sVar56 = auVar100._14_2_;
                  auVar98._12_2_ = -(ushort)(sVar73 < sVar55);
                  sVar74 = auVar75._14_2_;
                  auVar98._14_2_ = -(ushort)(sVar74 < sVar56);
                  auVar94._0_2_ = -(ushort)(sVar27 == sVar58);
                  auVar94._2_2_ = -(ushort)(sVar40 == sVar65);
                  auVar94._4_2_ = -(ushort)(sVar50 == sVar66);
                  auVar94._6_2_ = -(ushort)(sVar53 == sVar68);
                  auVar94._8_2_ = -(ushort)(sVar41 == sVar69);
                  auVar94._10_2_ = -(ushort)(sVar52 == sVar71);
                  auVar94._12_2_ = -(ushort)(sVar55 == sVar73);
                  auVar94._14_2_ = -(ushort)(sVar56 == sVar74);
                  auVar97._0_2_ = -(ushort)(-0x8000 < sVar27);
                  auVar97._2_2_ = -(ushort)(-0x8000 < sVar40);
                  auVar97._4_2_ = -(ushort)(-0x8000 < sVar50);
                  auVar97._6_2_ = -(ushort)(-0x8000 < sVar53);
                  auVar97._8_2_ = -(ushort)(-0x8000 < sVar41);
                  auVar97._10_2_ = -(ushort)(-0x8000 < sVar52);
                  auVar97._12_2_ = -(ushort)(-0x8000 < sVar55);
                  auVar97._14_2_ = -(ushort)(-0x8000 < sVar56);
                  auVar98 = auVar97 & auVar94 | auVar98;
                  if ((((((((((((((((auVar98 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                   && (auVar98 >> 0xf & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                  (auVar98 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar98 >> 0x1f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar98 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar98 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar98 >> 0x37 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar98 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar98 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar98 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar98 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar98 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar98 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar98 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar98 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < auVar98[0xf]) goto LAB_0065005e;
                  auVar62._0_2_ = -(ushort)(sVar27 < sVar58);
                  auVar62._2_2_ = -(ushort)(sVar40 < sVar65);
                  auVar62._4_2_ = -(ushort)(sVar50 < sVar66);
                  auVar62._6_2_ = -(ushort)(sVar53 < sVar68);
                  auVar62._8_2_ = -(ushort)(sVar41 < sVar69);
                  auVar62._10_2_ = -(ushort)(sVar52 < sVar71);
                  auVar62._12_2_ = -(ushort)(sVar55 < sVar73);
                  auVar62._14_2_ = -(ushort)(sVar56 < sVar74);
                  auVar116 = pblendvb(auVar116,auVar96,auVar62);
                  auVar45 = pblendvb(auVar45,auVar84,auVar62);
                  auVar75 = pmovsxbw(auVar62,0x101010101010101);
                  auVar80 = paddsw(local_f8,auVar75);
                  auVar75 = paddsw(auVar115,auVar75);
                  local_f8 = pblendvb(auVar80,auVar75,auVar62);
                  auVar75 = *(undefined1 (*) [16])((long)*palVar30 + lVar24);
                  auVar80 = local_198;
                }
                local_198 = auVar80;
              }
LAB_0065005e:
              sVar41 = local_198._0_2_;
              auVar48._0_2_ = -(ushort)(auVar63._0_2_ < sVar41);
              sVar52 = local_198._2_2_;
              auVar48._2_2_ = -(ushort)(auVar63._2_2_ < sVar52);
              sVar55 = local_198._4_2_;
              auVar48._4_2_ = -(ushort)(auVar63._4_2_ < sVar55);
              sVar56 = local_198._6_2_;
              auVar48._6_2_ = -(ushort)(auVar63._6_2_ < sVar56);
              sVar40 = local_198._8_2_;
              auVar48._8_2_ = -(ushort)(auVar63._8_2_ < sVar40);
              sVar27 = local_198._10_2_;
              auVar48._10_2_ = -(ushort)(auVar63._10_2_ < sVar27);
              sVar53 = local_198._12_2_;
              sVar50 = local_198._14_2_;
              auVar48._12_2_ = -(ushort)(auVar63._12_2_ < sVar53);
              auVar48._14_2_ = -(ushort)(auVar63._14_2_ < sVar50);
              local_1d8 = palVar21;
              local_1d0 = palVar31;
              local_1c8 = palVar30;
              if ((((((((((((((((auVar48 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar48 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar48 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar48 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar48 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar48 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar48 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar48 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar48 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar48 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar48 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar48 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar48._14_2_ >> 7 & 1) != 0) || (auVar48._14_2_ & 0x8000) != 0) {
                uVar82 = (ushort)(sVar40 < sVar41) * sVar41 | (ushort)(sVar40 >= sVar41) * sVar40;
                uVar51 = (ushort)(sVar27 < sVar52) * sVar52 | (ushort)(sVar27 >= sVar52) * sVar27;
                uVar54 = (ushort)(sVar53 < sVar55) * sVar55 | (ushort)(sVar53 >= sVar55) * sVar53;
                uVar85 = (ushort)(sVar50 < sVar56) * sVar56 | (ushort)(sVar50 >= sVar56) * sVar50;
                sVar40 = (ushort)(0 < sVar40) * sVar40;
                sVar27 = (ushort)(0 < sVar27) * sVar27;
                sVar53 = (ushort)(0 < sVar53) * sVar53;
                sVar50 = (ushort)(0 < sVar50) * sVar50;
                uVar82 = ((short)uVar54 < (short)uVar82) * uVar82 |
                         ((short)uVar54 >= (short)uVar82) * uVar54;
                uVar51 = ((short)uVar85 < (short)uVar51) * uVar51 |
                         ((short)uVar85 >= (short)uVar51) * uVar85;
                uVar54 = (sVar40 < (short)uVar54) * uVar54 |
                         (ushort)(sVar40 >= (short)uVar54) * sVar40;
                uVar85 = (sVar27 < (short)uVar85) * uVar85 |
                         (ushort)(sVar27 >= (short)uVar85) * sVar27;
                uVar86 = (ushort)(sVar53 < sVar40) * sVar40 | (ushort)(sVar53 >= sVar40) * sVar53;
                uVar57 = (ushort)(sVar50 < sVar27) * sVar27 | (ushort)(sVar50 >= sVar27) * sVar50;
                sVar53 = (ushort)(0 < sVar53) * sVar53;
                sVar50 = (ushort)(0 < sVar50) * sVar50;
                uVar82 = ((short)uVar51 < (short)uVar82) * uVar82 |
                         ((short)uVar51 >= (short)uVar82) * uVar51;
                auVar49._0_4_ =
                     CONCAT22(((short)uVar54 < (short)uVar51) * uVar51 |
                              ((short)uVar54 >= (short)uVar51) * uVar54,uVar82);
                auVar49._4_2_ =
                     ((short)uVar85 < (short)uVar54) * uVar54 |
                     ((short)uVar85 >= (short)uVar54) * uVar85;
                auVar49._6_2_ =
                     ((short)uVar86 < (short)uVar85) * uVar85 |
                     ((short)uVar86 >= (short)uVar85) * uVar86;
                auVar49._8_2_ =
                     ((short)uVar57 < (short)uVar86) * uVar86 |
                     ((short)uVar57 >= (short)uVar86) * uVar57;
                auVar49._10_2_ =
                     (sVar53 < (short)uVar57) * uVar57 | (ushort)(sVar53 >= (short)uVar57) * sVar53;
                auVar49._12_2_ =
                     (ushort)(sVar50 < sVar53) * sVar53 | (ushort)(sVar50 >= sVar53) * sVar50;
                auVar49._14_2_ = (ushort)(0 < sVar50) * sVar50;
                if ((short)(0x7ffe - (short)iVar19) < (short)uVar82) {
                  *(byte *)&result_00->flag = (byte)result_00->flag | 0x40;
                  palVar29 = palVar22;
                  palVar22 = palVar23;
                  goto LAB_006501a1;
                }
                auVar45 = pshuflw(auVar49,auVar49,0);
                uVar44 = auVar45._0_4_;
                auVar63._4_4_ = uVar44;
                auVar63._0_4_ = uVar44;
                auVar63._8_4_ = uVar44;
                auVar63._12_4_ = uVar44;
                local_178 = uVar32 & 0xffffffff;
                local_16c = auVar49._0_4_;
              }
              uVar32 = uVar32 + 1;
              local_158._0_8_ = local_180;
              palVar21 = palVar22;
              palVar22 = palVar23;
            }
            uVar32 = (ulong)(iVar3 + 1U);
            local_180 = (__m128i *)local_158._0_8_;
            palVar29 = palVar23;
            b = palVar31;
            b_00 = palVar21;
            auVar49._0_4_ = local_16c;
            local_1e0 = palVar30;
LAB_006501a1:
            palVar31 = local_1c8;
            palVar23 = local_1d0;
            palVar21 = local_1e0;
            sVar27 = (short)auVar49._0_4_;
            if (sVar27 == 0x7fff) {
LAB_006501c8:
              *(byte *)&result_00->flag = (byte)result_00->flag | 0x40;
            }
            else {
              auVar92._0_2_ = -(ushort)(local_1a8._0_2_ == 0x7fff);
              auVar92._2_2_ = -(ushort)(local_1a8._2_2_ == 0x7fff);
              auVar92._4_2_ = -(ushort)(local_1a8._4_2_ == 0x7fff);
              auVar92._6_2_ = -(ushort)(local_1a8._6_2_ == 0x7fff);
              auVar92._8_2_ = -(ushort)(local_1a8._8_2_ == 0x7fff);
              auVar92._10_2_ = -(ushort)(local_1a8._10_2_ == 0x7fff);
              auVar92._12_2_ = -(ushort)(local_1a8._12_2_ == 0x7fff);
              auVar92._14_2_ = -(ushort)(local_1a8._14_2_ == 0x7fff);
              if ((((((((((((((((auVar92 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar92 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar92 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar92 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar92 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar92 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar92 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar92 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar92 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar92 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar92 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar92 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar92 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar92 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar92._14_2_ >> 7 & 1) != 0) || (auVar92._14_2_ & 0x8000) != 0)
              goto LAB_006501c8;
            }
            iVar19 = parasail_result_is_saturated(result_00);
            palVar30 = palVar29;
            palVar37 = b_00;
            palVar38 = palVar22;
            if (iVar19 == 0) {
              if ((int)local_178 == (int)uVar32 + -1) {
                local_1e0 = local_1b0;
                palVar23 = b;
                palVar30 = local_180;
                local_1b0 = palVar21;
                b = local_1c0;
                palVar37 = local_1b8;
                local_198._0_8_ = b_00;
                local_1a8._0_8_ = palVar29;
              }
              else if ((int)local_178 == (int)uVar32 + -2) {
                local_198._0_8_ = local_1d8;
                local_1d8 = local_1b8;
                local_1d0 = local_1c0;
                local_1c8 = local_1b0;
                local_1b0 = palVar31;
                palVar38 = local_180;
                local_1a8._0_8_ = palVar22;
              }
              else {
                local_1a8._0_8_ = local_180;
                local_198._0_8_ = local_1b8;
                palVar23 = local_1c0;
              }
              sVar53 = -0x8000;
              uVar28 = 0;
              sVar50 = -0x8000;
              sVar40 = -0x8000;
              while( true ) {
                iVar19 = (int)uVar20;
                if ((uVar8 & 0xfffffff) << 3 == (uint)uVar28) break;
                if ((*(short *)((long)*local_1b0 + uVar28 * 2) == sVar27) &&
                   (uVar26 = ((uint)uVar28 & 7) * uVar8 + ((uint)(uVar28 >> 3) & 0x1fffffff),
                   (int)uVar26 < iVar19)) {
                  sVar40 = *(short *)((long)*palVar23 + uVar28 * 2);
                  sVar50 = *(short *)((long)(longlong *)local_198._0_8_ + uVar28 * 2);
                  sVar53 = *(short *)((long)(longlong *)local_1a8._0_8_ + uVar28 * 2);
                  uVar20 = (ulong)uVar26;
                }
                uVar28 = uVar28 + 1;
              }
              iVar36 = sVar27 + 0x8000;
              iVar33 = sVar40 + 0x8000;
              iVar18 = sVar50 + 0x8000;
              iVar35 = sVar53 + 0x8000;
              local_1b8 = (__m128i *)local_198._0_8_;
              local_180 = (__m128i *)local_1a8._0_8_;
              local_1c0 = palVar23;
            }
            else {
              local_178._0_4_ = 0;
              iVar35 = 0x8000;
              iVar18 = 0x8000;
              iVar33 = 0x8000;
              iVar36 = 0x8000;
              iVar19 = 0;
            }
            result_00->score = iVar36;
            result_00->end_query = iVar19;
            result_00->end_ref = (int)local_178;
            ((result_00->field_4).stats)->matches = iVar33;
            ((result_00->field_4).stats)->similar = iVar18;
            ((result_00->field_4).stats)->length = iVar35;
            parasail_free(local_180);
            parasail_free(local_1b8);
            parasail_free(local_1c0);
            parasail_free(local_1b0);
            parasail_free(b_04);
            parasail_free(b_03);
            parasail_free(b_02);
            parasail_free(b_01);
            parasail_free(palVar38);
            parasail_free(palVar30);
            parasail_free(local_1d8);
            parasail_free(palVar37);
            parasail_free(local_1d0);
            parasail_free(b);
            parasail_free(local_1c8);
            parasail_free(local_1e0);
            goto LAB_00650522;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar25 = "gap";
        }
      }
    }
  }
  result_00 = (parasail_result_t *)0x0;
  fprintf(_stderr,__format,"parasail_sw_stats_striped_profile_sse41_128_16_internal",pcVar25);
LAB_00650522:
  parasail_profile_free(profile_00);
  parasail_result_free(result);
  result_00->end_query = iVar17;
  result_00->end_ref = iVar3;
  return result_00;
}

Assistant:

parasail_result_t* INAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    const char *s1 = profile->s1;
    const parasail_matrix_t *matrix = profile->matrix;

    /* find the end loc first with the faster implementation */
    parasail_result_t *result = parasail_sw_striped_profile_sse41_128_16(profile, s2, s2Len, open, gap);
    if (!parasail_result_is_saturated(result)) {
#if 0
        int s1Len_new = 0;
        int s2Len_new = 0;
        char *s1_new = NULL;
        char *s2_new = NULL;
        parasail_profile_t *profile_new = NULL;
        parasail_result_t *result_new = NULL;
        int s1_begin = 0;
        int s2_begin = 0;
        int s1Len_final = 0;
        int s2Len_final = 0;
        parasail_profile_t *profile_final = NULL;
        parasail_result_t *result_final = NULL;

        /* using the end loc and the non-stats version of the function,
         * reverse the inputs and find the beg loc */
        s1Len_new = result->end_query+1;
        s2Len_new = result->end_ref+1;
        s1_new = parasail_reverse(s1, s1Len_new);
        s2_new = parasail_reverse(s2, s2Len_new);
        profile_new = parasail_profile_create_sse_128_16(
                s1_new, s1Len_new, matrix);
        profile_new->stop = result->score;
        result_new = parasail_sw_striped_profile_sse41_128_16(
                profile_new, s2_new, s2Len_new, open, gap);

        /* using both the beg and end loc, call the original stats func */
        s1_begin = s1Len_new - result_new->end_query - 1;
        s2_begin = s2Len_new - result_new->end_ref - 1;
        s1Len_final = s1Len_new - s1_begin;
        s2Len_final = s2Len_new - s2_begin;
        assert(s1_begin >= 0);
        assert(s2_begin >= 0);
        assert(s1Len_new > s1_begin);
        assert(s2Len_new > s2_begin);
        profile_final = parasail_profile_create_stats_sse_128_16(
                &s1[s1_begin], s1Len_final, matrix);
        result_final = PNAME(
                profile_final, &s2[s2_begin], s2Len_final, open, gap);

        /* clean up all the temporary profiles, sequences, and results */
        free(s1_new);
        free(s2_new);
        parasail_profile_free(profile_new);
        parasail_profile_free(profile_final);
        parasail_result_free(result);
        parasail_result_free(result_new);

        /* correct the end locations before returning */
        result_final->end_query = s1Len_new-1;
        result_final->end_ref = s2Len_new-1;
        return result_final;
#else
        int s1Len_new = 0;
        int s2Len_new = 0;
        parasail_profile_t *profile_final = NULL;
        parasail_result_t *result_final = NULL;

        /* using the end loc, call the original stats function */
        s1Len_new = result->end_query+1;
        s2Len_new = result->end_ref+1;
        profile_final = parasail_profile_create_stats_sse_128_16(
                s1, s1Len_new, matrix);
        result_final = PNAME(
                profile_final, s2, s2Len_new, open, gap);

        /* clean up all the temporary profiles, sequences, and results */
        parasail_profile_free(profile_final);
        parasail_result_free(result);

        /* correct the end locations before returning */
        result_final->end_query = s1Len_new-1;
        result_final->end_ref = s2Len_new-1;
        return result_final;
#endif
    }
    else {
        return result;
    }
}